

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<double> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  bool bVar1;
  type tVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  float_specs in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char in_R8B;
  int num_zeros;
  int num_zeros_3;
  int num_zeros_2;
  int exp;
  anon_class_40_7_ef14d3db write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  significand_type significand;
  iterator in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int value;
  undefined4 in_stack_fffffffffffffe84;
  undefined2 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8a;
  undefined1 in_stack_fffffffffffffe8b;
  undefined4 in_stack_fffffffffffffe8c;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe90;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe98;
  int local_134;
  basic_format_specs<char> *local_130;
  char *local_128;
  int *local_120;
  int *local_118;
  char *local_110;
  int *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  int local_f4;
  basic_format_specs<char> *local_f0;
  char *local_e8;
  int *local_e0;
  undefined8 *local_d8;
  float_specs *local_d0;
  char *local_c8;
  int *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  int local_b0;
  int local_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  uint local_98;
  char local_90;
  undefined1 uStack_8f;
  fill_t<char> fStack_8e;
  undefined1 uStack_89;
  int local_88;
  char local_84;
  int local_80;
  undefined1 local_7c;
  int local_78;
  undefined1 local_6d;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  anon_class_12_2_f0c9b3c6 local_58;
  int local_4c;
  ulong local_48;
  basic_format_specs<char> local_40;
  char local_29;
  int *local_28;
  undefined8 *local_20;
  float_specs local_18;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_40._8_8_ = *in_RSI;
  local_29 = in_R8B;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RCX;
  local_10.container = in_RDI;
  local_40.precision = get_significand_size<double>((decimal_fp<double> *)0x1d4f21);
  local_40.width = (uint)local_18._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(local_40.precision);
  local_48 = (ulong)(tVar2 + (local_40.width != 0));
  local_58.output_exp = *(int *)(local_20 + 1) + local_40.precision + -1;
  local_58.fspecs = local_18;
  local_4c = local_58.output_exp;
  bVar1 = write_float<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
          ::anon_class_12_2_f0c9b3c6::operator()(&local_58);
  if (bVar1) {
    local_5c = 0;
    if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
      if (local_40.precision == 1) {
        local_29 = '\0';
      }
    }
    else {
      local_60 = local_18.precision - local_40.precision;
      local_64 = 0;
      piVar4 = Catch::clara::std::max<int>(&local_60,&local_64);
      local_5c = *piVar4;
      tVar2 = to_unsigned<int>(local_5c);
      local_48 = tVar2 + local_48;
    }
    iVar3 = local_4c;
    if (local_4c < 0) {
      iVar3 = -local_4c;
    }
    local_6c = 2;
    if ((99 < iVar3) && (local_6c = 3, 999 < iVar3)) {
      local_6c = 4;
    }
    local_68 = iVar3;
    tVar2 = to_unsigned<int>((local_29 != '\0') + 2 + local_6c);
    local_48 = tVar2 + local_48;
    local_7c = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      local_7c = 0x65;
    }
    local_98 = local_40.width;
    local_90 = local_40.type;
    uStack_8f = local_40._9_1_;
    fStack_8e = local_40.fill;
    uStack_89 = local_40._15_1_;
    local_88 = local_40.precision;
    local_84 = local_29;
    local_80 = local_5c;
    local_78 = local_4c;
    local_6d = local_7c;
    if (*local_28 < 1) {
      local_a8 = local_10.container;
      reserve<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (in_stack_fffffffffffffe90,
                 CONCAT44(iVar3,CONCAT13(local_7c,CONCAT12(0x65,in_stack_fffffffffffffe88))));
      pcVar5 = write_float<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
               ::anon_class_40_7_ef14d3db::operator()
                         ((anon_class_40_7_ef14d3db *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          in_stack_fffffffffffffe78);
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                base_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_10,pcVar5);
    }
    else {
      local_a0 = local_10.container;
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90.container,
                           CONCAT44(iVar3,CONCAT13(local_7c,CONCAT12(0x65,in_stack_fffffffffffffe88)
                                                  )),
                           (anon_class_40_7_ef14d3db *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
  }
  else {
    local_ac = *(int *)(local_20 + 1) + local_40.precision;
    if (*(int *)(local_20 + 1) < 0) {
      if (local_ac < 1) {
        local_134 = -local_ac;
        if (((local_40.precision == 0) && (-1 < local_18.precision)) &&
           (local_18.precision < local_134)) {
          local_134 = local_18.precision;
        }
        tVar2 = to_unsigned<int>(local_134);
        local_48 = (tVar2 + 2) + local_48;
        local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_134,&local_40,
                             CONCAT44(in_stack_fffffffffffffe8c,
                                      CONCAT13(in_stack_fffffffffffffe8b,
                                               CONCAT12(in_stack_fffffffffffffe8a,
                                                        in_stack_fffffffffffffe88))),
                             (anon_class_48_6_9afe1116 *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
      else {
        if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = local_18.precision - local_40.precision;
        }
        value = iVar3;
        if (iVar3 < 1) {
          value = 0;
        }
        local_f4 = iVar3;
        tVar2 = to_unsigned<int>(value);
        local_48 = (tVar2 + 1) + local_48;
        local_100 = local_10.container;
        local_130 = &local_40;
        local_128 = &local_40.type;
        local_120 = &local_40.precision;
        local_118 = &local_ac;
        local_110 = &local_29;
        local_108 = &local_f4;
        local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_>
                            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90.container,
                             CONCAT44(in_stack_fffffffffffffe8c,
                                      CONCAT13(in_stack_fffffffffffffe8b,
                                               CONCAT12(in_stack_fffffffffffffe8a,
                                                        in_stack_fffffffffffffe88))),
                             (anon_class_48_6_48d028d1 *)CONCAT44(iVar3,value));
      }
    }
    else {
      tVar2 = to_unsigned<int>(*(int *)(local_20 + 1));
      local_48 = tVar2 + local_48;
      local_b0 = local_18.precision - local_ac;
      if (((uint)local_18._4_4_ >> 0x14 & 1) != 0) {
        if ((local_b0 < 1) && (local_18._4_1_ != '\x02')) {
          local_b0 = 1;
        }
        if (0 < local_b0) {
          tVar2 = to_unsigned<int>(local_b0);
          local_48 = tVar2 + local_48;
        }
      }
      local_b8 = local_10.container;
      local_f0 = &local_40;
      local_e8 = &local_40.type;
      local_e0 = &local_40.precision;
      local_d8 = local_20;
      local_d0 = &local_18;
      local_c8 = &local_29;
      local_c0 = &local_b0;
      local_8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_>
                          (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90.container,
                           CONCAT44(in_stack_fffffffffffffe8c,
                                    CONCAT13(in_stack_fffffffffffffe8b,
                                             CONCAT12(in_stack_fffffffffffffe8a,
                                                      in_stack_fffffffffffffe88))),
                           (anon_class_56_7_a2a26a24 *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )local_8;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}